

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadCodeSection(BinaryReader *this,Offset section_size)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bool bVar1;
  int iVar2;
  Result RVar3;
  _func_int **pp_Var4;
  ulong in_RCX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  Index i;
  ulong uVar5;
  pointer puVar6;
  char *pcVar7;
  BinaryReaderDelegate *pBVar8;
  Index k;
  uint uVar9;
  uint uVar10;
  pointer __new_size;
  ulong uVar11;
  uint uVar12;
  Type TVar13;
  BinaryReaderDelegate **ppBVar14;
  uint local_74;
  uint local_70;
  Index num_local_decls;
  uint local_68;
  uint32_t body_size;
  ulong uStack_60;
  Type local_type;
  undefined1 uStack_58;
  Index num_local_types;
  uint local_3c;
  BinaryReaderDelegate **ppBStack_38;
  Address offset;
  
  iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x30])();
  if (iVar2 == 0) {
    RVar3 = ReadCount(this,&this->num_function_bodies_,"function body count");
    if (RVar3.enum_ == Error) {
      return (Result)Error;
    }
    if (this->num_function_signatures_ == this->num_function_bodies_) {
      iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x31])();
      if (iVar2 == 0) {
        this_00 = &this->target_depths_;
        ppBStack_38 = &this->delegate_;
        for (uVar12 = 0; uVar12 < this->num_function_bodies_; uVar12 = uVar12 + 1) {
          uVar9 = this->num_func_imports_ + uVar12;
          RVar3 = ReadU32Leb128(this,&num_local_decls,"function body size");
          if (RVar3.enum_ == Error) {
            return (Result)Error;
          }
          uStack_60 = (this->state_).offset + (ulong)num_local_decls;
          local_70 = uVar9;
          iVar2 = (*this->delegate_->_vptr_BinaryReaderDelegate[0x32])(this->delegate_,(ulong)uVar9)
          ;
          if (iVar2 != 0) {
            pcVar7 = "BeginFunctionBody callback failed";
            goto LAB_00d7bc3d;
          }
          RVar3 = ReadCount(this,&local_74,"local declaration count");
          uVar9 = local_74;
          if (RVar3.enum_ == Error) {
            return (Result)Error;
          }
          iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x33])(*ppBStack_38,(ulong)local_74);
          if (iVar2 != 0) {
            pcVar7 = "OnLocalDeclCount callback failed";
LAB_00d7d340:
            PrintError(this,pcVar7);
            return (Result)Error;
          }
          uVar5 = 0;
          pcVar7 = extraout_RDX;
          for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
            RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"local type count");
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            uVar11 = _uStack_58 & 0xffffffff;
            if (uVar11 == 0) {
              pcVar7 = "local count must be > 0";
              goto LAB_00d7d340;
            }
            uVar5 = uVar5 + uVar11;
            if (0xfffffffe < uVar5) {
              pcVar7 = "local count must be < 0x10000000";
              goto LAB_00d7d340;
            }
            RVar3 = ReadType(this,(Type *)&body_size,"local type");
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            in_RCX = (ulong)body_size;
            if ((3 < body_size + 4) &&
               ((body_size != 0xfffffffb || ((this->options_->features).simd_enabled_ != true)))) {
              pcVar7 = "expected valid local type";
              goto LAB_00d7d340;
            }
            iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x34])
                              (*ppBStack_38,(ulong)uVar10,uVar11);
            if (iVar2 != 0) {
              pcVar7 = "OnLocalDecl callback failed";
              goto LAB_00d7d340;
            }
            pcVar7 = extraout_RDX_00;
          }
          local_68 = 0;
          uVar5 = uStack_60;
          ppBVar14 = ppBStack_38;
LAB_00d7be24:
          uVar11 = (this->state_).offset;
          if (uVar11 < uVar5) {
            RVar3 = ReadOpcode(this,(Opcode *)&body_size,pcVar7);
            if (RVar3.enum_ == Error) {
              return (Result)Error;
            }
            iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x35])(*ppBVar14,(ulong)body_size);
            if (iVar2 != 0) {
              pcVar7 = "OnOpcode callback failed";
              goto LAB_00d7d340;
            }
            bVar1 = Opcode::IsEnabled((Opcode *)&body_size,&this->options_->features);
            if (!bVar1) {
switchD_00d7be8a_caseD_b8:
              RVar3 = ReportUnexpectedOpcode(this,(Opcode)body_size,(char *)0x0);
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              goto LAB_00d7cf13;
            }
            switch(body_size) {
            case 0:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x75])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnUnreachableExpr callback failed";
              goto LAB_00d7d340;
            case 1:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x67])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnNopExpr callback failed";
              goto LAB_00d7d340;
            case 2:
              RVar3 = ReadType(this,(Type *)&stack0xffffffffffffffa8,"block signature type");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              bVar1 = IsBlockType(this,_uStack_58);
              if (!bVar1) goto LAB_00d7d0a1;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x46])
                                (*ppBStack_38,uVar5 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnBlockExpr callback failed";
                goto LAB_00d7d340;
              }
LAB_00d7cc52:
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x3e])
                                (*ppBStack_38,(ulong)(uint)TVar13);
              pcVar7 = extraout_RDX_16;
              uVar5 = uStack_60;
              ppBVar14 = ppBStack_38;
              if (iVar2 != 0) {
                pcVar7 = "OnOpcodeBlockSig callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 3:
              RVar3 = ReadType(this,(Type *)&stack0xffffffffffffffa8,"loop signature type");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              bVar1 = IsBlockType(this,_uStack_58);
              if (!bVar1) goto LAB_00d7d0a1;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x5d])
                                (*ppBStack_38,uVar5 & 0xffffffff);
              if (iVar2 == 0) goto LAB_00d7cc52;
              pcVar7 = "OnLoopExpr callback failed";
              goto LAB_00d7d340;
            case 4:
              RVar3 = ReadType(this,(Type *)&stack0xffffffffffffffa8,"if signature type");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              bVar1 = IsBlockType(this,_uStack_58);
              if (!bVar1) goto LAB_00d7d0a1;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x5a])
                                (*ppBStack_38,uVar5 & 0xffffffff);
              if (iVar2 == 0) goto LAB_00d7cc52;
              pcVar7 = "OnIfExpr callback failed";
              goto LAB_00d7d340;
            case 5:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x50])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnElseExpr callback failed";
              goto LAB_00d7d340;
            case 6:
              RVar3 = ReadType(this,(Type *)&stack0xffffffffffffffa8,"try signature type");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              bVar1 = IsBlockType(this,_uStack_58);
              if (!bVar1) goto LAB_00d7d0a1;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x72])
                                (*ppBStack_38,uVar5 & 0xffffffff);
              if (iVar2 == 0) goto LAB_00d7cc52;
              pcVar7 = "OnTryExpr callback failed";
              goto LAB_00d7d340;
            case 7:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x4c])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnCatchExpr callback failed";
              goto LAB_00d7d340;
            case 8:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"exception index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x71])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnThrowExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 9:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x68])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnRethrowExpr callback failed";
              goto LAB_00d7d340;
            case 10:
              RVar3 = ReadType(this,(Type *)&stack0xffffffffffffffa8,"if signature type");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              bVar1 = IsBlockType(this,_uStack_58);
              if (!bVar1) {
LAB_00d7d0a1:
                pcVar7 = "expected valid block signature type";
                goto LAB_00d7d340;
              }
              RVar3 = ReadIndex(this,&local_3c,"exception index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x5b])
                                (*ppBStack_38,uVar5 & 0xffffffff,(ulong)local_3c);
              pcVar7 = extraout_RDX_14;
              uVar5 = uStack_60;
              ppBVar14 = ppBStack_38;
              if (iVar2 != 0) {
                pcVar7 = "OnIfExceptExpr callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 0xb:
              pp_Var4 = this->delegate_->_vptr_BinaryReaderDelegate;
              if ((this->state_).offset == uVar5) {
                iVar2 = (*pp_Var4[0x52])();
                in_RCX = CONCAT71((int7)(in_RCX >> 8),1);
                local_68 = (uint)in_RCX;
                pcVar7 = extraout_RDX_03;
                uVar5 = uStack_60;
                ppBVar14 = ppBStack_38;
                if (iVar2 != 0) {
                  pcVar7 = "OnEndFunc callback failed";
                  goto LAB_00d7d340;
                }
              }
              else {
                iVar2 = (*pp_Var4[0x51])();
                pcVar7 = extraout_RDX_06;
                uVar5 = uStack_60;
                ppBVar14 = ppBStack_38;
                if (iVar2 != 0) {
                  pcVar7 = "OnEndExpr callback failed";
                  goto LAB_00d7d340;
                }
              }
              goto LAB_00d7be24;
            case 0xc:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"br depth");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x47])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnBrExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0xd:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"br_if depth");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x48])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnBrIfExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0xe:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"br_table target count");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              __new_size = (pointer)(_uStack_58 & 0xffffffff);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                        (this_00,(size_type)__new_size);
              for (puVar6 = (pointer)0x0; __new_size != puVar6; puVar6 = (pointer)((long)puVar6 + 1)
                  ) {
                RVar3 = ReadIndex(this,&local_3c,"br_table target depth");
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
                (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[(long)puVar6] = local_3c;
              }
              RVar3 = ReadIndex(this,&local_3c,"br_table default target depth");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              puVar6 = __new_size;
              if (__new_size != (pointer)0x0) {
                puVar6 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                         _M_impl.super__Vector_impl_data._M_start;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x49])
                                (*ppBStack_38,__new_size,puVar6,in_RCX);
              pcVar7 = extraout_RDX_19;
              uVar5 = uStack_60;
              ppBVar14 = ppBStack_38;
              if (iVar2 != 0) {
                pcVar7 = "OnBrTableExpr callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 0xf:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x69])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnReturnExpr callback failed";
              goto LAB_00d7d340;
            case 0x10:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"call function index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              if (this->num_function_signatures_ + this->num_func_imports_ <= (uint)_uStack_58) {
                pcVar7 = "invalid call function index: %u";
LAB_00d7d231:
                PrintError(this,pcVar7,(ulong)(uint)_uStack_58);
                return (Result)Error;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x4a])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnCallExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0x11:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,
                                "call_indirect signature index");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              if ((uint)_uStack_58 < this->num_signatures_) {
                RVar3 = ReadU8(this,(uint8_t *)&local_3c,"call_indirect reserved");
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
                if ((char)local_3c == '\0') {
                  iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x4b])
                                    (*ppBStack_38,uVar5 & 0xffffffff);
                  if (iVar2 == 0) goto LAB_00d7cdb5;
                  pcVar7 = "OnCallIndirectExpr callback failed";
                }
                else {
                  pcVar7 = "call_indirect reserved value must be 0";
                }
              }
              else {
                pcVar7 = "invalid call_indirect signature index";
              }
              goto LAB_00d7d340;
            case 0x12:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"return_call");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              if (this->num_function_signatures_ + this->num_func_imports_ <= (uint)_uStack_58) {
                pcVar7 = "invalid return_call function index: %u";
                goto LAB_00d7d231;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x6a])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnReturnCallExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0x13:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"return_call_indirect");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              if ((uint)_uStack_58 < this->num_signatures_) {
                RVar3 = ReadU8(this,(uint8_t *)&local_3c,"return_call_indirect reserved");
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
                if ((char)local_3c == '\0') {
                  iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x6b])
                                    (*ppBStack_38,uVar5 & 0xffffffff);
                  if (iVar2 == 0) goto LAB_00d7cdb5;
                  pcVar7 = "OnReturnCallIndirectExpr callback failed";
                }
                else {
                  pcVar7 = "return_call_indirect reserved value must be 0";
                }
              }
              else {
                pcVar7 = "invalid return_call_indirect signature index";
              }
              goto LAB_00d7d340;
            case 0x14:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x4f])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnDropExpr callback failed";
              goto LAB_00d7d340;
            case 0x15:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x6c])();
              if (iVar2 == 0) goto LAB_00d7c278;
              pcVar7 = "OnSelectExpr callback failed";
              goto LAB_00d7d340;
            case 0x16:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"get_local local index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x57])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnGetLocalExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0x17:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"set_local local index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x6e])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnSetLocalExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0x18:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"tee_local local index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x70])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnTeeLocalExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0x19:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"get_global global index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x56])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnGetGlobalExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0x1a:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"set_global global index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x6d])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnSetGlobalExpr callback failed";
                goto LAB_00d7d340;
              }
              break;
            case 0x1b:
            case 0x1c:
            case 0x1d:
            case 0x1e:
            case 0x1f:
            case 0x20:
            case 0x21:
            case 0x22:
            case 0x23:
            case 0x24:
            case 0x25:
            case 0x26:
            case 0x27:
            case 0x28:
            case 0xcc:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"load alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"load offset");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x5c])
                                (*ppBVar14,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 == 0) goto LAB_00d7c10b;
              pcVar7 = "OnLoadExpr callback failed";
              goto LAB_00d7d340;
            case 0x29:
            case 0x2a:
            case 0x2b:
            case 0x2c:
            case 0x2d:
            case 0x2e:
            case 0x2f:
            case 0x30:
            case 0x31:
            case 0xcd:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"store alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"store offset");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x6f])
                                (*ppBVar14,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 == 0) goto LAB_00d7c10b;
              pcVar7 = "OnStoreExpr callback failed";
              goto LAB_00d7d340;
            case 0x32:
              RVar3 = ReadU8(this,&stack0xffffffffffffffa8,"memory.size reserved");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              if (uStack_58 == Any) {
                iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[99])();
                if (iVar2 == 0) goto LAB_00d7c9da;
                pcVar7 = "OnMemorySizeExpr callback failed";
              }
              else {
                pcVar7 = "memory.size reserved value must be 0";
              }
              goto LAB_00d7d340;
            case 0x33:
              RVar3 = ReadU8(this,&stack0xffffffffffffffa8,"memory.grow reserved");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              if (uStack_58 == Any) {
                iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x61])();
                if (iVar2 == 0) goto LAB_00d7c9da;
                pcVar7 = "OnMemoryGrowExpr callback failed";
              }
              else {
                pcVar7 = "memory.grow reserved value must be 0";
              }
              goto LAB_00d7d340;
            case 0x34:
              RVar3 = ReadS32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"i32.const value");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x58])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 == 0) {
                pBVar8 = *ppBStack_38;
                uVar5 = _uStack_58 & 0xffffffff;
                pp_Var4 = pBVar8->_vptr_BinaryReaderDelegate;
                goto LAB_00d7c9e6;
              }
              pcVar7 = "OnI32ConstExpr callback failed";
              goto LAB_00d7d340;
            case 0x35:
              RVar3 = ReadS64Leb128(this,(uint64_t *)&stack0xffffffffffffffa8,"i64.const value");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x59])(*ppBStack_38,_uStack_58);
              if (iVar2 == 0) {
                iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x3a])(*ppBStack_38,_uStack_58)
                ;
                pcVar7 = extraout_RDX_12;
                ppBVar14 = ppBStack_38;
                goto joined_r0x00d7c350;
              }
              pcVar7 = "OnI64ConstExpr callback failed";
              goto LAB_00d7d340;
            case 0x36:
              _uStack_58 = _uStack_58 & 0xffffffff00000000;
              RVar3 = ReadF32(this,(uint32_t *)&stack0xffffffffffffffa8,"f32.const value");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x53])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 != 0) {
                pcVar7 = "OnF32ConstExpr callback failed";
                goto LAB_00d7d340;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x3b])
                                (*ppBStack_38,uVar5 & 0xffffffff);
              pcVar7 = extraout_RDX_10;
              uVar5 = uStack_60;
              ppBVar14 = ppBStack_38;
              if (iVar2 != 0) {
                pcVar7 = "OnOpcodeF32 callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 0x37:
              _uStack_58 = 0;
              RVar3 = ReadF64(this,(uint64_t *)&stack0xffffffffffffffa8,"f64.const value");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x54])(*ppBStack_38,_uStack_58);
              if (iVar2 != 0) {
                pcVar7 = "OnF64ConstExpr callback failed";
                goto LAB_00d7d340;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x3c])(*ppBStack_38,uVar5);
              pcVar7 = extraout_RDX_11;
              uVar5 = uStack_60;
              ppBVar14 = ppBStack_38;
              if (iVar2 != 0) {
                pcVar7 = "OnOpcodeF64 callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 0x38:
            case 0x43:
            case 0x9a:
            case 0x9b:
            case 0x9c:
            case 0x9d:
            case 0x9e:
            case 0x9f:
            case 0xa0:
            case 0xa1:
            case 0xa2:
            case 0xa3:
            case 0xa4:
            case 0xa5:
            case 0xa6:
            case 0xa7:
            case 0xa8:
            case 0xa9:
            case 0xaa:
            case 0xab:
            case 0xac:
            case 0xad:
            case 0xae:
            case 0xaf:
            case 0xb0:
            case 0xb1:
            case 0xb2:
            case 0xbd:
            case 0xbe:
            case 0xbf:
            case 0xc0:
            case 0xc1:
            case 0xc2:
            case 0xc3:
            case 0xc4:
            case 0x150:
            case 0x151:
            case 0x152:
            case 0x153:
            case 0x154:
            case 0x155:
            case 0x156:
            case 0x157:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x4e])();
              if (iVar2 == 0) goto LAB_00d7bedf;
              pcVar7 = "OnConvertExpr callback failed";
              goto LAB_00d7d340;
            case 0x39:
            case 0x3a:
            case 0x3b:
            case 0x3c:
            case 0x3d:
            case 0x3e:
            case 0x3f:
            case 0x40:
            case 0x41:
            case 0x42:
            case 0x44:
            case 0x45:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4a:
            case 0x4b:
            case 0x4c:
            case 0x4d:
            case 0x4e:
            case 0x4f:
            case 0x50:
            case 0x51:
            case 0x52:
            case 0x53:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
            case 0x58:
            case 0x59:
            case 0xe4:
            case 0xe5:
            case 0xe6:
            case 0xe7:
            case 0xe8:
            case 0xe9:
            case 0xea:
            case 0xeb:
            case 0xec:
            case 0xed:
            case 0xee:
            case 0xef:
            case 0xf0:
            case 0xf1:
            case 0xf2:
            case 0xf3:
            case 0xf4:
            case 0xf5:
            case 0xf6:
            case 0xf7:
            case 0xf8:
            case 0xf9:
            case 0xfa:
            case 0xfb:
            case 0xfc:
            case 0xfd:
            case 0xfe:
            case 0xff:
            case 0x100:
            case 0x101:
            case 0x102:
            case 0x103:
            case 0x104:
            case 0x105:
            case 0x106:
            case 0x107:
            case 0x108:
            case 0x109:
            case 0x10a:
            case 0x10b:
            case 0x10c:
            case 0x10d:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x4d])();
              if (iVar2 == 0) goto LAB_00d7bedf;
              pcVar7 = "OnCompareExpr callback failed";
              goto LAB_00d7d340;
            case 0x5a:
            case 0x5b:
            case 0x5c:
            case 0x6c:
            case 0x6d:
            case 0x6e:
            case 0x7e:
            case 0x7f:
            case 0x80:
            case 0x81:
            case 0x82:
            case 0x83:
            case 0x84:
            case 0x8c:
            case 0x8d:
            case 0x8e:
            case 0x8f:
            case 0x90:
            case 0x91:
            case 0x92:
            case 0xb3:
            case 0xb4:
            case 0xb5:
            case 0xb6:
            case 0xb7:
            case 0xd0:
            case 0xd4:
            case 0xd8:
            case 0xdb:
            case 0xde:
            case 0xe1:
            case 0x10e:
            case 0x113:
            case 0x114:
            case 0x115:
            case 0x120:
            case 0x121:
            case 0x122:
            case 0x12d:
            case 0x12e:
            case 0x12f:
            case 0x136:
            case 0x137:
            case 0x138:
            case 0x13e:
            case 0x13f:
            case 0x140:
            case 0x147:
            case 0x148:
            case 0x149:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x73])();
              if (iVar2 == 0) goto LAB_00d7bedf;
              pcVar7 = "OnUnaryExpr callback failed";
              goto LAB_00d7d340;
            case 0x5d:
            case 0x5e:
            case 0x5f:
            case 0x60:
            case 0x61:
            case 0x62:
            case 99:
            case 100:
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x68:
            case 0x69:
            case 0x6a:
            case 0x6b:
            case 0x6f:
            case 0x70:
            case 0x71:
            case 0x72:
            case 0x73:
            case 0x74:
            case 0x75:
            case 0x76:
            case 0x77:
            case 0x78:
            case 0x79:
            case 0x7a:
            case 0x7b:
            case 0x7c:
            case 0x7d:
            case 0x85:
            case 0x86:
            case 0x87:
            case 0x88:
            case 0x89:
            case 0x8a:
            case 0x8b:
            case 0x93:
            case 0x94:
            case 0x95:
            case 0x96:
            case 0x97:
            case 0x98:
            case 0x99:
            case 0x10f:
            case 0x110:
            case 0x111:
            case 0x116:
            case 0x117:
            case 0x118:
            case 0x119:
            case 0x11a:
            case 0x11b:
            case 0x11c:
            case 0x11d:
            case 0x11e:
            case 0x11f:
            case 0x123:
            case 0x124:
            case 0x125:
            case 0x126:
            case 0x127:
            case 0x128:
            case 0x129:
            case 0x12a:
            case 299:
            case 300:
            case 0x130:
            case 0x131:
            case 0x132:
            case 0x133:
            case 0x134:
            case 0x135:
            case 0x139:
            case 0x13a:
            case 0x13b:
            case 0x13c:
            case 0x13d:
            case 0x141:
            case 0x142:
            case 0x143:
            case 0x144:
            case 0x145:
            case 0x146:
            case 0x14a:
            case 0x14b:
            case 0x14c:
            case 0x14d:
            case 0x14e:
            case 0x14f:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x45])();
              if (iVar2 == 0) {
LAB_00d7bedf:
                iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x36])();
                pcVar7 = extraout_RDX_01;
                goto joined_r0x00d7beed;
              }
              pcVar7 = "OnBinaryExpr callback failed";
              goto LAB_00d7d340;
            default:
              goto switchD_00d7be8a_caseD_b8;
            case 0xc5:
              RVar3 = ReadU8(this,(uint8_t *)&local_3c,"reserved memory index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              if ((char)local_3c == '\0') {
                RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"elem segment index");
                if (RVar3.enum_ == Error) {
                  return (Result)Error;
                }
                TVar13 = _uStack_58;
                iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x62])
                                  (*ppBStack_38,_uStack_58 & 0xffffffff);
                if (iVar2 == 0) goto LAB_00d7cdb5;
                pcVar7 = "OnMemoryInitExpr callback failed";
              }
              else {
LAB_00d7d095:
                pcVar7 = "reserved value must be 0";
              }
              goto LAB_00d7d340;
            case 0xc6:
            case 0xca:
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"segment index");
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              pp_Var4 = (*ppBVar14)->_vptr_BinaryReaderDelegate;
              if (body_size == 0xc6) {
                iVar2 = (*pp_Var4[0x5f])();
                if (iVar2 != 0) {
                  pcVar7 = "OnMemoryDropExpr callback failed";
                  goto LAB_00d7d340;
                }
              }
              else {
                iVar2 = (*pp_Var4[0x65])(*ppBVar14,_uStack_58 & 0xffffffff);
                if (iVar2 != 0) {
                  pcVar7 = "OnTableDropExpr callback failed";
                  goto LAB_00d7d340;
                }
              }
              ppBVar14 = ppBStack_38;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x37])
                                (*ppBStack_38,uVar5 & 0xffffffff);
              pcVar7 = extraout_RDX_05;
              goto joined_r0x00d7c448;
            case 199:
            case 200:
              RVar3 = ReadU8(this,&stack0xffffffffffffffa8,"reserved memory index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              if (uStack_58 != Any) goto LAB_00d7d095;
              if (body_size == 199) {
                iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x5e])();
                if (iVar2 != 0) {
                  pcVar7 = "OnMemoryCopyExpr callback failed";
                  goto LAB_00d7d340;
                }
              }
              else {
                iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x60])();
                if (iVar2 != 0) {
                  pcVar7 = "OnMemoryFillExpr callback failed";
                  goto LAB_00d7d340;
                }
              }
              ppBVar14 = ppBStack_38;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x37])(*ppBStack_38,0);
              pcVar7 = extraout_RDX_09;
              goto joined_r0x00d7c448;
            case 0xc9:
              RVar3 = ReadU8(this,(uint8_t *)&local_3c,"reserved table index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              if ((char)local_3c != '\0') goto LAB_00d7d095;
              RVar3 = ReadIndex(this,(Index *)&stack0xffffffffffffffa8,"elem segment index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              TVar13 = _uStack_58;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x66])
                                (*ppBStack_38,_uStack_58 & 0xffffffff);
              if (iVar2 == 0) {
LAB_00d7cdb5:
                pBVar8 = *ppBStack_38;
                pp_Var4 = pBVar8->_vptr_BinaryReaderDelegate;
                uVar5 = 0;
LAB_00d7cdc4:
                iVar2 = (*pp_Var4[0x39])(pBVar8,(ulong)(uint)TVar13,uVar5);
                pcVar7 = extraout_RDX_17;
                uVar5 = uStack_60;
                ppBVar14 = ppBStack_38;
                goto joined_r0x00d7c41b;
              }
              pcVar7 = "OnTableInitExpr callback failed";
              goto LAB_00d7d340;
            case 0xcb:
              RVar3 = ReadU8(this,&stack0xffffffffffffffa8,"reserved table index");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              if (uStack_58 != Any) goto LAB_00d7d095;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[100])();
              if (iVar2 != 0) {
                pcVar7 = "OnTableCopyExpr callback failed";
                goto LAB_00d7d340;
              }
LAB_00d7c9da:
              pBVar8 = *ppBStack_38;
              pp_Var4 = pBVar8->_vptr_BinaryReaderDelegate;
              uVar5 = 0;
LAB_00d7c9e6:
              iVar2 = (*pp_Var4[0x37])(pBVar8,uVar5);
              pcVar7 = extraout_RDX_13;
              ppBVar14 = ppBStack_38;
joined_r0x00d7c448:
              uVar5 = uStack_60;
              if (iVar2 != 0) {
                pcVar7 = "OnOpcodeUint32 callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 0xce:
              _uStack_58 = 0;
              _num_local_types = 0;
              RVar3 = ReadV128(this,(v128 *)&stack0xffffffffffffffa8,"v128.const value");
              uVar11 = _num_local_types;
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x55])
                                (*ppBStack_38,_uStack_58,_num_local_types);
              if (iVar2 == 0) goto LAB_00d7ce65;
              pcVar7 = "OnV128ConstExpr callback failed";
              goto LAB_00d7d340;
            case 0xcf:
              RVar3 = ReadV128(this,(v128 *)&stack0xffffffffffffffa8,"Lane idx [16]");
              uVar11 = _num_local_types;
              uVar5 = _uStack_58;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = _num_local_types;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x79])
                                (*ppBStack_38,(ulong)body_size,_uStack_58,_num_local_types);
              if (iVar2 == 0) goto LAB_00d7ce65;
              pcVar7 = "OnSimdShuffleOpExpr callback failed";
              goto LAB_00d7d340;
            case 0xd1:
            case 0xd2:
            case 0xd3:
            case 0xd5:
            case 0xd6:
            case 0xd7:
            case 0xd9:
            case 0xda:
            case 0xdc:
            case 0xdd:
            case 0xdf:
            case 0xe0:
            case 0xe2:
            case 0xe3:
              RVar3 = ReadU8(this,&stack0xffffffffffffffa8,"Lane idx");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              uVar5 = _uStack_58 & 0xff;
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x78])
                                (*ppBVar14,(ulong)body_size,uVar5);
              if (iVar2 != 0) {
                pcVar7 = "OnSimdLaneOpExpr callback failed";
                goto LAB_00d7d340;
              }
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x3a])(*ppBVar14,uVar5);
              pcVar7 = extraout_RDX_07;
joined_r0x00d7c350:
              uVar5 = uStack_60;
              if (iVar2 != 0) {
                pcVar7 = "OnOpcodeUint64 callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 0x112:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x74])(*ppBVar14,0x112);
              if (iVar2 != 0) {
                pcVar7 = "OnTernaryExpr callback failed";
                goto LAB_00d7d340;
              }
LAB_00d7c278:
              ppBVar14 = ppBStack_38;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x36])();
              pcVar7 = extraout_RDX_04;
              uVar5 = uStack_60;
joined_r0x00d7beed:
              if (iVar2 != 0) {
                pcVar7 = "OnOpcodeBare callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            case 0x158:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"load alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"load offset");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x44])
                                (*ppBStack_38,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 == 0) {
                pBVar8 = *ppBStack_38;
                uVar5 = (ulong)local_3c;
                pp_Var4 = pBVar8->_vptr_BinaryReaderDelegate;
                TVar13 = _uStack_58;
                goto LAB_00d7cdc4;
              }
              pcVar7 = "OnAtomicWakeExpr callback failed";
              goto LAB_00d7d340;
            case 0x159:
            case 0x15a:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"load alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"load offset");
              ppBVar14 = ppBStack_38;
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x43])
                                (*ppBStack_38,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 == 0) {
                iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x39])
                                  (*ppBVar14,_uStack_58 & 0xffffffff,(ulong)local_3c);
                pcVar7 = extraout_RDX_08;
                uVar5 = uStack_60;
                goto joined_r0x00d7c41b;
              }
              pcVar7 = "OnAtomicWaitExpr callback failed";
              goto LAB_00d7d340;
            case 0x15b:
            case 0x15c:
            case 0x15d:
            case 0x15e:
            case 0x15f:
            case 0x160:
            case 0x161:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"load alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"load offset");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x3f])
                                (*ppBVar14,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 == 0) goto LAB_00d7c10b;
              pcVar7 = "OnAtomicLoadExpr callback failed";
              goto LAB_00d7d340;
            case 0x162:
            case 0x163:
            case 0x164:
            case 0x165:
            case 0x166:
            case 0x167:
            case 0x168:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"store alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"store offset");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x40])
                                (*ppBVar14,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 == 0) goto LAB_00d7c10b;
              pcVar7 = "OnAtomicStoreExpr callback failed";
              goto LAB_00d7d340;
            case 0x169:
            case 0x16a:
            case 0x16b:
            case 0x16c:
            case 0x16d:
            case 0x16e:
            case 0x16f:
            case 0x170:
            case 0x171:
            case 0x172:
            case 0x173:
            case 0x174:
            case 0x175:
            case 0x176:
            case 0x177:
            case 0x178:
            case 0x179:
            case 0x17a:
            case 0x17b:
            case 0x17c:
            case 0x17d:
            case 0x17e:
            case 0x17f:
            case 0x180:
            case 0x181:
            case 0x182:
            case 0x183:
            case 0x184:
            case 0x185:
            case 0x186:
            case 0x187:
            case 0x188:
            case 0x189:
            case 0x18a:
            case 0x18b:
            case 0x18c:
            case 0x18d:
            case 0x18e:
            case 399:
            case 400:
            case 0x191:
            case 0x192:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"memory alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"memory offset");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x41])
                                (*ppBVar14,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 == 0) goto LAB_00d7c10b;
              pcVar7 = "OnAtomicRmwExpr callback failed";
              goto LAB_00d7d340;
            case 0x193:
            case 0x194:
            case 0x195:
            case 0x196:
            case 0x197:
            case 0x198:
            case 0x199:
              RVar3 = ReadU32Leb128(this,(uint32_t *)&stack0xffffffffffffffa8,"memory alignment");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              RVar3 = ReadU32Leb128(this,&local_3c,"memory offset");
              if (RVar3.enum_ == Error) {
                return (Result)Error;
              }
              in_RCX = (ulong)local_3c;
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x42])
                                (*ppBVar14,(ulong)body_size,_uStack_58 & 0xffffffff,in_RCX);
              if (iVar2 != 0) {
                pcVar7 = "OnAtomicRmwCmpxchgExpr callback failed";
                goto LAB_00d7d340;
              }
LAB_00d7c10b:
              iVar2 = (*(*ppBVar14)->_vptr_BinaryReaderDelegate[0x39])
                                (*ppBVar14,_uStack_58 & 0xffffffff,(ulong)local_3c);
              pcVar7 = extraout_RDX_02;
joined_r0x00d7c41b:
              if (iVar2 != 0) {
                pcVar7 = "OnOpcodeUint32Uint32 callback failed";
                goto LAB_00d7d340;
              }
              goto LAB_00d7be24;
            }
            iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x38])
                              (*ppBStack_38,(ulong)(uint)TVar13);
            pcVar7 = extraout_RDX_15;
            uVar5 = uStack_60;
            ppBVar14 = ppBStack_38;
            if (iVar2 != 0) {
              pcVar7 = "OnOpcodeIndex callback failed";
              goto LAB_00d7d340;
            }
            goto LAB_00d7be24;
          }
          if (uVar11 != uVar5) {
            pcVar7 = "function body longer than given size";
            goto LAB_00d7d340;
          }
          if ((local_68 & 1) == 0) {
            pcVar7 = "function body must end with END opcode";
            goto LAB_00d7bc3d;
          }
LAB_00d7cf13:
          iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x76])(*ppBStack_38,(ulong)local_70);
          if (iVar2 != 0) {
            pcVar7 = "EndFunctionBody callback failed";
            goto LAB_00d7bc3d;
          }
        }
        iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x77])();
        if (iVar2 == 0) {
          return (Result)Ok;
        }
        pcVar7 = "EndCodeSection callback failed";
      }
      else {
        pcVar7 = "OnFunctionBodyCount callback failed";
      }
    }
    else {
      pcVar7 = "function signature count != function body count";
    }
  }
  else {
    pcVar7 = "BeginCodeSection callback failed";
  }
LAB_00d7bc3d:
  PrintError(this,pcVar7);
  return (Result)Error;
LAB_00d7ce65:
  iVar2 = (*(*ppBStack_38)->_vptr_BinaryReaderDelegate[0x3d])(*ppBStack_38,uVar5,uVar11);
  pcVar7 = extraout_RDX_18;
  uVar5 = uStack_60;
  ppBVar14 = ppBStack_38;
  if (iVar2 != 0) {
    pcVar7 = "OnOpcodeV128 callback failed";
    goto LAB_00d7d340;
  }
  goto LAB_00d7be24;
}

Assistant:

Result BinaryReader::ReadCodeSection(Offset section_size) {
  CALLBACK(BeginCodeSection, section_size);
  CHECK_RESULT(ReadCount(&num_function_bodies_, "function body count"));
  ERROR_UNLESS(num_function_signatures_ == num_function_bodies_,
               "function signature count != function body count");
  CALLBACK(OnFunctionBodyCount, num_function_bodies_);
  for (Index i = 0; i < num_function_bodies_; ++i) {
    Index func_index = num_func_imports_ + i;
    Offset func_offset = state_.offset;
    state_.offset = func_offset;
    uint32_t body_size;
    CHECK_RESULT(ReadU32Leb128(&body_size, "function body size"));
    Offset body_start_offset = state_.offset;
    Offset end_offset = body_start_offset + body_size;
    CALLBACK(BeginFunctionBody, func_index, body_size);

    uint64_t total_locals = 0;
    Index num_local_decls;
    CHECK_RESULT(ReadCount(&num_local_decls, "local declaration count"));
    CALLBACK(OnLocalDeclCount, num_local_decls);
    for (Index k = 0; k < num_local_decls; ++k) {
      Index num_local_types;
      CHECK_RESULT(ReadIndex(&num_local_types, "local type count"));
      ERROR_UNLESS(num_local_types > 0, "local count must be > 0");
      total_locals += num_local_types;
      ERROR_UNLESS(total_locals < UINT32_MAX,
                   "local count must be < 0x10000000");
      Type local_type;
      CHECK_RESULT(ReadType(&local_type, "local type"));
      ERROR_UNLESS(IsConcreteType(local_type), "expected valid local type");
      CALLBACK(OnLocalDecl, k, num_local_types, local_type);
    }

    CHECK_RESULT(ReadFunctionBody(end_offset));

    CALLBACK(EndFunctionBody, func_index);
  }
  CALLBACK0(EndCodeSection);
  return Result::Ok;
}